

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O1

CURLcode imap_perform_upgrade_tls(connectdata *conn)

{
  _Bool *done;
  CURLcode CVar1;
  
  done = &(conn->proto).imapc.ssldone;
  CVar1 = Curl_ssl_connect_nonblocking(conn,0,done);
  if (CVar1 == CURLE_OK) {
    if ((conn->proto).imapc.state != IMAP_UPGRADETLS) {
      (conn->proto).imapc.state = IMAP_UPGRADETLS;
    }
    CVar1 = CURLE_OK;
    if (*done == true) {
      conn->handler = &Curl_handler_imaps;
      conn->tls_upgraded = true;
      (conn->proto).ftpc.diralloc = 0;
      *(undefined4 *)((long)&conn->proto + 0x8c) = 0;
      (conn->proto).imapc.tls_supported = false;
      CVar1 = imap_sendf(conn,"CAPABILITY");
      if (CVar1 == CURLE_OK) {
        (conn->proto).imapc.state = IMAP_CAPABILITY;
      }
    }
  }
  return CVar1;
}

Assistant:

static CURLcode imap_perform_upgrade_tls(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct imap_conn *imapc = &conn->proto.imapc;

  /* Start the SSL connection */
  result = Curl_ssl_connect_nonblocking(conn, FIRSTSOCKET, &imapc->ssldone);

  if(!result) {
    if(imapc->state != IMAP_UPGRADETLS)
      state(conn, IMAP_UPGRADETLS);

    if(imapc->ssldone) {
      imap_to_imaps(conn);
      result = imap_perform_capability(conn);
    }
  }

  return result;
}